

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::
statement<std::__cxx11::string_const&,char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
          (CompilerGLSL *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
          char **ts_1,char (*ts_2) [4],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,char (*ts_4) [2])

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  bool bVar1;
  char (*in_stack_ffffffffffffff88) [2];
  uint local_5c;
  undefined1 local_58 [4];
  uint32_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  char (*ts_local_4) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_3;
  char (*ts_local_2) [4];
  char **ts_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local;
  CompilerGLSL *this_local;
  
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_4;
  ts_local_4 = (char (*) [2])ts_3;
  ts_local_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_2;
  ts_local_2 = (char (*) [4])ts_1;
  ts_local_1 = (char **)ts;
  ts_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (bVar1) {
    this->statement_count = this->statement_count + 1;
  }
  else if (this->redirect_statement ==
           (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            *)0x0) {
    for (local_5c = 0; local_5c < this->indent; local_5c = local_5c + 1) {
      StringStream<4096UL,_4096UL>::operator<<(&this->buffer,"    ");
    }
    statement_inner<std::__cxx11::string_const&,char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_local_1,
               (char **)ts_local_2,(char (*) [4])ts_local_3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_local_4,
               (char (*) [2])local_38);
    StringStream<4096UL,_4096UL>::operator<<(&this->buffer,'\n');
  }
  else {
    this_00 = this->redirect_statement;
    join<std::__cxx11::string_const&,char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              ((string *)local_58,(spirv_cross *)ts_local_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_local_2,
               (char **)ts_local_3,(char (*) [4])ts_local_4,local_38,in_stack_ffffffffffffff88);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_58);
    ::std::__cxx11::string::~string((string *)local_58);
    this->statement_count = this->statement_count + 1;
  }
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}